

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

string * convert(char *from,char *to,char *_src,size_t size,string *out)

{
  byte bVar1;
  size_t sVar2;
  int *piVar3;
  char *__s;
  ostream *poVar4;
  byte *pbVar5;
  int iVar6;
  char *src;
  size_t dst_len;
  string orig_src;
  size_t src_len;
  char *dst;
  char to_ignore [100];
  byte *local_f8;
  string *local_f0;
  iconv_t local_e8;
  size_t local_e0;
  size_t local_d8;
  byte *local_d0 [2];
  byte local_c0 [16];
  pointer local_b0;
  size_t local_a8;
  pointer local_a0;
  char local_98 [104];
  
  if (size == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x149191);
  }
  else {
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,_src,_src + size);
    local_e0 = size * 2 + 10;
    std::__cxx11::string::resize((ulong)out,(char)local_e0);
    local_b0 = (out->_M_dataplus)._M_p;
    local_f0 = out;
    sprintf(local_98,"%s//IGNORE",to);
    local_e8 = iconv_open(local_98,from);
    if (local_e8 == (iconv_t)0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"iconv_open error: ",0x12);
      if (from == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15d520);
      }
      else {
        sVar2 = strlen(from);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,from,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," -> ",4);
      if (to == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15d520);
      }
      else {
        sVar2 = strlen(to);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,to,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      std::__cxx11::string::_M_replace
                ((ulong)local_f0,0,(char *)local_f0->_M_string_length,0x149191);
    }
    else {
      iVar6 = 100;
      do {
        local_f8 = local_d0[0];
        local_a0 = local_b0;
        local_d8 = local_e0;
        local_a8 = size;
        sVar2 = iconv(local_e8,(char **)&local_f8,&local_a8,&local_a0,&local_d8);
        if ((sVar2 != 0xffffffffffffffff) || (size <= (ulong)((long)local_f8 - (long)local_d0[0])))
        {
          iconv_close(local_e8);
          std::__cxx11::string::resize((ulong)local_f0,(char)local_e0 - (char)local_d8);
          goto LAB_0013f916;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"iconv failed: ",0xe);
        if (from == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15d520);
        }
        else {
          sVar2 = strlen(from);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,from,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,",",1);
        if (to == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15d520);
        }
        else {
          sVar2 = strlen(to);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,to,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        piVar3 = __errno_location();
        __s = strerror(*piVar3);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15d520);
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"at ",3);
        poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pbVar5 = local_f8;
        if (local_f8 + (2 - (long)local_d0[0]) < size) {
          bVar1 = *local_f8;
          *local_f8 = 0x20;
          if (0x80 < bVar1) {
            pbVar5 = local_f8 + 1;
            goto LAB_0013f7cb;
          }
        }
        else {
LAB_0013f7cb:
          *pbVar5 = 0x20;
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      std::__cxx11::string::resize((ulong)local_f0,'\0');
    }
LAB_0013f916:
    out = local_f0;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
      out = local_f0;
    }
  }
  return out;
}

Assistant:

static std::string& convert(const char* from, const char* to, const char* _src, size_t size, std::string* out)
{
    // std::cout<<"convert " << from <<"," << to << "," << size << std::endl;
    if (size == 0 ) {
        *out = "";
        return *out;
    }

    std::string orig_src(_src, size);

    size_t buf_len = size*2 + 10;
    out->resize(buf_len);

    char* out_buf = (char*)out->data();

    char to_ignore[100];
    // char from_ignore[100];
    sprintf(to_ignore, "%s//IGNORE", to);
    iconv_t ic = iconv_open(to_ignore, from);
    // iconv_t ic = iconv_open(to, from);

    if ((size_t)ic == -1) {
        std::cerr << "iconv_open error: " << from << " -> " << to << std::endl;
        *out = "";
        return *out;
    }


    //while (true) {
    for (int i = 0; i < 100; i++) { // max try 100
        char* src = (char*)orig_src.data();
        char* dst = out_buf;
        size_t dst_len = buf_len;
        size_t src_len = size;

        size_t ret = iconv(ic, (char**)&src, &src_len, &dst, &dst_len);
        if ( (ret == (size_t)-1) && (src - orig_src.data() < size) ) {
            std::cerr << "iconv failed: " << from << "," << to << ":" << strerror(errno)
                << "at " << (src - orig_src.data()) << std::endl;

            if (src - orig_src.data() + 2 < size) {
                if ((uint8_t)src[0] > 0x80 ) {
                    src[0] = ' ';
                    src[1] = ' ';
                }
                else {
                    src[0] = ' ';
                }
            } else {
                src[0] = ' ';
            }
            continue;
        } else {
            iconv_close(ic);
            out->resize(buf_len - dst_len);            
            return *out;
        }
    }
    out->resize(0);
    return *out;
}